

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O3

void core::image::save_jpg_file(ConstPtr *image,string *filename,int quality)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  FILE *__stream;
  invalid_argument *this;
  FileException *this_00;
  int *piVar4;
  char *msg;
  Exception *pEVar5;
  undefined1 local_340 [8];
  jpeg_error_mgr jerr;
  undefined1 local_288 [32];
  int local_268;
  uint local_264;
  int local_260;
  int local_25c;
  uint local_144;
  _Alloc_hider local_50;
  JSAMPROW row_pointer;
  
  peVar3 = (image->super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>)
           ._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Null image given");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (((peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.c | 2U) == 3) {
    __stream = fopen((filename->_M_dataplus)._M_p,"wb");
    if (__stream == (FILE *)0x0) {
      this_00 = (FileException *)__cxa_allocate_exception(0x48);
      piVar4 = __errno_location();
      msg = strerror(*piVar4);
      util::FileException::FileException(this_00,filename,msg);
      __cxa_throw(this_00,&util::FileException::typeinfo,util::FileException::~FileException);
    }
    jerr._160_8_ = jpeg_std_error(local_340);
    piVar4 = &jerr.first_addon_message;
    jpeg_CreateCompress(piVar4,0x50,0x248);
    jpeg_stdio_dest(piVar4,__stream);
    peVar3 = (image->
             super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    local_268 = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
    local_264 = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.h;
    local_260 = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
    local_25c = local_260;
    if (local_260 != 1) {
      if (local_260 != 3) {
        jpeg_destroy_compress(&jerr.first_addon_message);
        fclose(__stream);
        pEVar5 = (Exception *)__cxa_allocate_exception(0x28);
        local_50._M_p = &stack0xffffffffffffffc0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xffffffffffffffb0,"Invalid image color space","");
        util::Exception::Exception(pEVar5,(string *)&stack0xffffffffffffffb0);
        __cxa_throw(pEVar5,&util::Exception::typeinfo,util::Exception::~Exception);
      }
      local_25c = 2;
    }
    jpeg_set_defaults(piVar4);
    jpeg_set_quality(piVar4,quality,1);
    jpeg_start_compress(piVar4,1);
    if (local_144 < local_264) {
      peVar3 = (image->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      iVar1 = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.c;
      iVar2 = (peVar3->super_TypedImageBase<unsigned_char>).super_ImageBase.w;
      do {
        local_50._M_p =
             (pointer)((peVar3->super_TypedImageBase<unsigned_char>).data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + local_144 * iVar1 * iVar2);
        jpeg_write_scanlines(&jerr.first_addon_message,&stack0xffffffffffffffb0,1);
      } while (local_144 < local_264);
    }
    jpeg_finish_compress(&jerr.first_addon_message);
    jpeg_destroy_compress(&jerr.first_addon_message);
    fclose(__stream);
    return;
  }
  pEVar5 = (Exception *)__cxa_allocate_exception(0x28);
  jerr._160_8_ = local_288;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&jerr.first_addon_message,"Invalid image color space","");
  util::Exception::Exception(pEVar5,(string *)&jerr.first_addon_message);
  __cxa_throw(pEVar5,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

void
save_jpg_file (ByteImage::ConstPtr image, std::string const& filename, int quality)
{
    if (image == nullptr)
        throw std::invalid_argument("Null image given");

    if (image->channels() != 1 && image->channels() != 3)
        throw util::Exception("Invalid image color space");

    FILE* fp = std::fopen(filename.c_str(), "wb");
    if (!fp)
        throw util::FileException(filename, std::strerror(errno));

    struct jpeg_compress_struct cinfo;
    struct jpeg_error_mgr jerr;

    /* Setup error handler and info object. */
    cinfo.err = jpeg_std_error(&jerr);
    jpeg_create_compress(&cinfo);
    jpeg_stdio_dest(&cinfo, fp);

    /* Specify image dimensions. */
    cinfo.image_width = image->width();
    cinfo.image_height = image->height();
    cinfo.input_components = image->channels();
    switch (image->channels())
    {
        case 1: cinfo.in_color_space = JCS_GRAYSCALE; break;
        case 3: cinfo.in_color_space = JCS_RGB; break;
        default:
        {
            jpeg_destroy_compress(&cinfo);
            std::fclose(fp);
            throw util::Exception("Invalid image color space");
        }
    }

    /* Set default compression parameters. */
    jpeg_set_defaults(&cinfo);
    jpeg_set_quality(&cinfo, quality, TRUE);
    jpeg_start_compress(&cinfo, TRUE);

    ByteImage::ImageData const& data = image->get_data();
    int row_stride = image->width() * image->channels();
    while (cinfo.next_scanline < cinfo.image_height)
    {
        JSAMPROW row_pointer = const_cast<JSAMPROW>(
            &data[cinfo.next_scanline * row_stride]);
        jpeg_write_scanlines(&cinfo, &row_pointer, 1);
    }
    jpeg_finish_compress(&cinfo);
    jpeg_destroy_compress(&cinfo);
    std::fclose(fp);
}